

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O0

void __thiscall Potassco::AspifTextOutput::AspifTextOutput(AspifTextOutput *this,ostream *os)

{
  __buckets_ptr __s;
  TheoryData *in_RSI;
  Data *in_RDI;
  
  AbstractProgram::AbstractProgram((AbstractProgram *)in_RDI);
  (in_RDI->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__AspifTextOutput_0015c378;
  (in_RDI->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_RSI;
  TheoryData::TheoryData(in_RSI);
  *(undefined4 *)&(in_RDI->strings)._M_h._M_bucket_count = 0xffffffff;
  *(undefined1 *)((long)&(in_RDI->strings)._M_h._M_bucket_count + 4) = 0;
  *(undefined4 *)&(in_RDI->strings)._M_h._M_before_begin._M_nxt = 0;
  *(undefined4 *)((long)&(in_RDI->strings)._M_h._M_before_begin._M_nxt + 4) = 0;
  __s = (__buckets_ptr)operator_new(0xa8);
  memset(__s,0,0xa8);
  Data::Data(in_RDI);
  (in_RDI->strings)._M_h._M_buckets = __s;
  return;
}

Assistant:

AspifTextOutput::AspifTextOutput(std::ostream& os) : os_(os), step_(-1), showAtoms_(0), startAtom_(0), maxAtom_(0) {
	data_ = new Data();
}